

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O3

int AF_A_Raise(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  undefined8 *puVar2;
  player_t *this;
  bool bVar3;
  PClass *pPVar4;
  int iVar5;
  PClass *pPVar6;
  DPSprite *this_00;
  undefined4 extraout_var;
  undefined4 in_register_00000014;
  ulong uVar7;
  VMValue *pVVar8;
  char *__assertion;
  undefined8 *puVar9;
  bool bVar10;
  bool bVar11;
  double dVar12;
  undefined1 auVar13 [16];
  
  pPVar4 = AActor::RegistrationInfo.MyClass;
  uVar7 = CONCAT44(in_register_00000014,numparam);
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_0055a570;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    puVar9 = (undefined8 *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (puVar9 == (undefined8 *)0x0) {
LAB_0055a3f7:
        bVar3 = true;
        puVar9 = (undefined8 *)0x0;
        pVVar8 = param;
      }
      else {
        auVar13._8_8_ = uVar7;
        auVar13._0_8_ = puVar9[1];
        if (puVar9[1] == 0) {
          auVar13 = (**(code **)*puVar9)(puVar9);
          puVar9[1] = auVar13._0_8_;
        }
        pPVar6 = auVar13._0_8_;
        bVar10 = pPVar6 == (PClass *)0x0;
        ret = (VMReturn *)(ulong)!bVar10;
        uVar7 = (ulong)bVar10;
        bVar11 = pPVar6 == pPVar4;
        if (!bVar11 && !bVar10) {
          do {
            pPVar6 = pPVar6->ParentClass;
            ret = (VMReturn *)(ulong)(pPVar6 != (PClass *)0x0);
            if (pPVar6 == pPVar4) break;
          } while (pPVar6 != (PClass *)0x0);
        }
        if ((char)ret == '\0') {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_0055a570;
        }
        bVar3 = false;
        pVVar8 = (VMValue *)(ulong)(bVar11 || bVar10);
      }
      pPVar4 = AActor::RegistrationInfo.MyClass;
      if (numparam == 1) goto LAB_0055a4b7;
      VVar1 = param[1].field_0.field_3.Type;
      if (VVar1 != 0xff) {
        if (VVar1 != '\x03') goto LAB_0055a54e;
        puVar2 = (undefined8 *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (puVar2 != (undefined8 *)0x0) {
            pPVar6 = (PClass *)puVar2[1];
            if (pPVar6 == (PClass *)0x0) {
              pPVar6 = (PClass *)(**(code **)*puVar2)(puVar2,pVVar8,uVar7,ret);
              puVar2[1] = pPVar6;
            }
            bVar10 = pPVar6 != (PClass *)0x0;
            if (pPVar6 != pPVar4 && bVar10) {
              do {
                pPVar6 = pPVar6->ParentClass;
                bVar10 = pPVar6 != (PClass *)0x0;
                if (pPVar6 == pPVar4) break;
              } while (pPVar6 != (PClass *)0x0);
            }
            if (!bVar10) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_0055a570;
            }
          }
        }
        else if (puVar2 != (undefined8 *)0x0) goto LAB_0055a54e;
      }
      if (((numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
         ((VVar1 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_0055a4b7:
        if ((!bVar3) && (this = (player_t *)puVar9[0x40], this != (player_t *)0x0)) {
          if (this->PendingWeapon == (AWeapon *)0xffffffffffffffff) {
            if (this->ReadyWeapon != (AWeapon *)0x0) {
              this_00 = player_t::GetPSprite(this,PSP_WEAPON);
              dVar12 = this_00->y + -6.0;
              this_00->y = dVar12;
              if (dVar12 <= 32.375) {
                this_00->y = 32.375;
                iVar5 = (*(this->ReadyWeapon->super_AInventory).super_AActor.super_DThinker.
                          super_DObject._vptr_DObject[0x46])();
                DPSprite::SetState(this_00,(FState *)CONCAT44(extraout_var,iVar5),false);
              }
            }
          }
          else {
            P_DropWeapon(this);
          }
        }
        return 0;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_0055a570;
    }
    if (puVar9 == (undefined8 *)0x0) goto LAB_0055a3f7;
  }
LAB_0055a54e:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_0055a570:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                ,0x452,"int AF_A_Raise(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AInventory, A_Raise)
{
	PARAM_ACTION_PROLOGUE;

	if (self == nullptr)
	{
		return 0;
	}
	player_t *player = self->player;
	DPSprite *psp;

	if (nullptr == player)
	{
		return 0;
	}
	if (player->PendingWeapon != WP_NOCHANGE)
	{
		P_DropWeapon(player);
		return 0;
	}
	if (player->ReadyWeapon == nullptr)
	{
		return 0;
	}
	psp = player->GetPSprite(PSP_WEAPON);
	psp->y -= RAISESPEED;
	if (psp->y > WEAPONTOP)
	{ // Not raised all the way yet
		return 0;
	}
	psp->y = WEAPONTOP;
	psp->SetState(player->ReadyWeapon->GetReadyState());
	return 0;
}